

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libevent-client.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  size_t sVar2;
  SSL_METHOD *meth;
  SSL_CTX *pSVar3;
  undefined8 uVar4;
  void *pvVar5;
  undefined8 *puVar6;
  undefined1 *__dest;
  SSL *pSVar7;
  undefined8 uVar8;
  ulong uVar9;
  ushort uVar10;
  char *pcVar11;
  uint16_t uVar12;
  char *unaff_R15;
  http_parser_url local_108;
  undefined8 local_e8;
  void *local_e0;
  SSL_CTX *local_d8;
  char *local_d0;
  _union_1457 local_c8;
  undefined1 local_c0 [144];
  
  if (argc < 2) {
    main_cold_1();
  }
  else {
    memset(local_c0,0,0x90);
    local_c8 = (_union_1457)0x1;
    sigaction(0xd,(sigaction *)&local_c8,(sigaction *)0x0);
    unaff_R15 = argv[1];
    sVar2 = strlen(unaff_R15);
    iVar1 = http_parser_parse_url(unaff_R15,sVar2,0,&local_108);
    if (iVar1 == 0) {
      local_d0 = strndup(unaff_R15 + local_108.field_data[1].off,(ulong)local_108.field_data[1].len)
      ;
      uVar10 = 0x1bb;
      if ((local_108.field_set & 4) != 0) {
        uVar10 = local_108.port;
      }
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar3 = SSL_CTX_new(meth);
      if (pSVar3 == (SSL_CTX *)0x0) {
        uVar9 = ERR_get_error();
        unaff_R15 = ERR_error_string(uVar9,(char *)0x0);
        pcVar11 = "Could not create SSL/TLS context: %s";
      }
      else {
        SSL_CTX_set_options(pSVar3,0x82030850);
        local_d8 = pSVar3;
        SSL_CTX_set_alpn_protos(pSVar3,"\x02h2",3);
        uVar4 = event_base_new();
        sVar2 = 1;
        pvVar5 = calloc(1,0x20);
        local_e8 = uVar4;
        uVar4 = evdns_base_new(uVar4,1);
        *(undefined8 *)((long)pvVar5 + 8) = uVar4;
        local_e0 = pvVar5;
        puVar6 = (undefined8 *)malloc(0x38);
        *puVar6 = unaff_R15;
        puVar6[1] = &local_108;
        *(undefined4 *)(puVar6 + 6) = 0xffffffff;
        uVar9 = (ulong)local_108.field_data[1].len;
        puVar6[4] = uVar9;
        pvVar5 = malloc(uVar9 + 7);
        puVar6[2] = pvVar5;
        memcpy(pvVar5,unaff_R15 + local_108.field_data[1].off,uVar9);
        uVar12 = local_108.field_set;
        if ((local_108.field_set & 4) != 0) {
          iVar1 = snprintf((char *)((long)pvVar5 + uVar9),7,":%u",(ulong)local_108.port);
          puVar6[4] = (long)iVar1 + uVar9;
          uVar12 = local_108.field_set;
        }
        puVar6[5] = 1;
        if ((uVar12 & 8) != 0) {
          sVar2 = (size_t)local_108.field_data[3].len;
          puVar6[5] = sVar2;
        }
        if ((uVar12 & 0x10) != 0) {
          sVar2 = sVar2 + local_108.field_data[4].len + 1;
          puVar6[5] = sVar2;
        }
        __dest = (undefined1 *)malloc(sVar2);
        puVar6[3] = __dest;
        if ((uVar12 & 8) == 0) {
          *__dest = 0x2f;
        }
        else {
          memcpy(__dest,unaff_R15 + local_108.field_data[3].off,(ulong)local_108.field_data[3].len);
        }
        if ((uVar12 & 0x10) != 0) {
          uVar9 = (ulong)local_108.field_data[4].len;
          __dest[~uVar9 + sVar2] = 0x3f;
          memcpy(__dest + (sVar2 - uVar9),unaff_R15 + local_108.field_data[4].off,uVar9);
        }
        pSVar3 = local_d8;
        pvVar5 = local_e0;
        *(undefined8 **)((long)local_e0 + 0x18) = puVar6;
        pSVar7 = SSL_new(local_d8);
        uVar4 = local_e8;
        if (pSVar7 == (SSL *)0x0) {
          uVar9 = ERR_get_error();
          unaff_R15 = ERR_error_string(uVar9,(char *)0x0);
          pcVar11 = "Could not create SSL/TLS session object: %s";
        }
        else {
          uVar8 = bufferevent_openssl_socket_new(local_e8,0xffffffff,pSVar7,1,5);
          bufferevent_enable(uVar8,6);
          bufferevent_setcb(uVar8,readcb,writecb,eventcb,pvVar5);
          unaff_R15 = local_d0;
          iVar1 = bufferevent_socket_connect_hostname
                            (uVar8,*(undefined8 *)((long)pvVar5 + 8),0,local_d0,uVar10);
          if (iVar1 == 0) {
            *(undefined8 *)((long)pvVar5 + 0x10) = uVar8;
            free(unaff_R15);
            event_base_loop(uVar4,0);
            event_base_free(uVar4);
            SSL_CTX_free(pSVar3);
            return 0;
          }
          pcVar11 = "Could not connect to the remote host %s";
        }
      }
      goto LAB_00102a6e;
    }
  }
  pcVar11 = "Could not parse URI %s";
LAB_00102a6e:
  errx(1,pcVar11,unaff_R15);
}

Assistant:

int main(int argc, char **argv) {
  struct sigaction act;

  if (argc < 2) {
    fprintf(stderr, "Usage: libevent-client HTTPS_URI\n");
    exit(EXIT_FAILURE);
  }

  memset(&act, 0, sizeof(struct sigaction));
  act.sa_handler = SIG_IGN;
  sigaction(SIGPIPE, &act, NULL);

  run(argv[1]);
  return 0;
}